

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::processElements
          (TraverseSchema *this,DOMElement *elem,ComplexTypeInfo *baseTypeInfo,
          ComplexTypeInfo *newTypeInfo)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  XMLSize_t XVar4;
  SchemaGrammar *this_00;
  GrammarResolver *this_01;
  XMLCh *text1;
  uint uVar5;
  int iVar6;
  SchemaElementDecl *elem_00;
  undefined4 extraout_var;
  Grammar *pGVar7;
  QName *pQVar8;
  long lVar9;
  XMLSize_t i;
  XMLSize_t index;
  NamespaceScopeManager nsMgr;
  undefined4 extraout_var_00;
  
  NamespaceScopeManager::NamespaceScopeManager(&nsMgr,elem,this->fSchemaInfo,this);
  if ((baseTypeInfo->fElements != (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0) &&
     (XVar4 = (baseTypeInfo->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).
              fCurCount, XVar4 != 0)) {
    uVar1 = newTypeInfo->fScopeDefined;
    uVar5 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                      (this->fURIStringPool,SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    for (index = 0; XVar4 != index; index = index + 1) {
      this_00 = this->fSchemaGrammar;
      elem_00 = ComplexTypeInfo::elementAt(baseTypeInfo,index);
      uVar2 = elem_00->fEnclosingScope;
      if (uVar2 == 0xfffffffe) {
LAB_0031e346:
        ComplexTypeInfo::addElement(newTypeInfo,elem_00);
      }
      else {
        pQVar8 = (elem_00->super_XMLElementDecl).fElementName;
        uVar3 = pQVar8->fURIId;
        if (((uVar3 == uVar5) || (uVar3 == this->fTargetNSURI)) ||
           (uVar3 == this->fEmptyNamespaceURI)) {
LAB_0031e3a6:
          text1 = pQVar8->fLocalPart;
          iVar6 = (*(this_00->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])
                            (this_00,(ulong)uVar3,text1,0,(ulong)uVar1);
          lVar9 = CONCAT44(extraout_var_00,iVar6);
          if (lVar9 == 0) {
            elem_00->fEnclosingScope = uVar1;
            SchemaGrammar::putGroupElemDecl(this_00,&elem_00->super_XMLElementDecl);
            elem_00->fEnclosingScope = uVar2;
            goto LAB_0031e346;
          }
          if ((elem_00->fComplexTypeInfo != *(ComplexTypeInfo **)(lVar9 + 0x50)) ||
             (elem_00->fDatatypeValidator != *(DatatypeValidator **)(lVar9 + 0x78))) {
            reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x43,text1,(XMLCh *)0x0,
                              (XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
        else {
          this_01 = this->fGrammarResolver;
          iVar6 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[10])
                            (this->fURIStringPool,(ulong)uVar3);
          pGVar7 = GrammarResolver::getGrammar(this_01,(XMLCh *)CONCAT44(extraout_var,iVar6));
          if (pGVar7 != (Grammar *)0x0) {
            iVar6 = (*(pGVar7->super_XSerializable)._vptr_XSerializable[5])(pGVar7);
            if (iVar6 == 1) {
              pQVar8 = (elem_00->super_XMLElementDecl).fElementName;
              goto LAB_0031e3a6;
            }
          }
        }
      }
    }
  }
  NamespaceScopeManager::~NamespaceScopeManager(&nsMgr);
  return;
}

Assistant:

void TraverseSchema::processElements(const DOMElement* const elem,
                                     ComplexTypeInfo* const baseTypeInfo,
                                     ComplexTypeInfo* const newTypeInfo) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    XMLSize_t elemCount = baseTypeInfo->elementCount();

    if (elemCount) {

        int newTypeScope = newTypeInfo->getScopeDefined();
        int schemaURI = fURIStringPool->addOrFind(SchemaSymbols::fgURI_SCHEMAFORSCHEMA);

        for (XMLSize_t i=0; i < elemCount; i++) {

            SchemaGrammar*     aGrammar = fSchemaGrammar;
            SchemaElementDecl* elemDecl = baseTypeInfo->elementAt(i);
            int elemURI = elemDecl->getURI();
            unsigned int elemScope = elemDecl->getEnclosingScope();

            if (elemScope != Grammar::TOP_LEVEL_SCOPE) {

                if (elemURI != fTargetNSURI && elemURI != schemaURI && elemURI != fEmptyNamespaceURI) {
                    Grammar* aGrammar = fGrammarResolver->getGrammar(fURIStringPool->getValueForId(elemURI));

                    if (!aGrammar || aGrammar->getGrammarType() != Grammar::SchemaGrammarType) {
                        continue; // REVISIT - error message
                    }
                }

                const XMLCh*             localPart = elemDecl->getBaseName();
                const SchemaElementDecl* other = (SchemaElementDecl*)
                    aGrammar->getElemDecl(elemURI, localPart, 0, newTypeScope);

                if (other) {

                    if (elemDecl->getComplexTypeInfo() != other->getComplexTypeInfo()
                        || elemDecl->getDatatypeValidator() != other->getDatatypeValidator()) {
                        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateElementDeclaration, localPart);
                    }

                    continue;
                }
                elemDecl->setEnclosingScope(newTypeScope);
                ((SchemaGrammar*) aGrammar)->putGroupElemDecl(elemDecl);
                elemDecl->setEnclosingScope(elemScope);
            }

            newTypeInfo->addElement(elemDecl);
        }
    }
}